

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

void __thiscall
CMU462::DynamicScene::XFormWidget::setSelection(XFormWidget *this,int pickID,Selection *selection)

{
  mapped_type mVar1;
  bool bVar2;
  mapped_type *pmVar3;
  _Self local_30;
  _Self local_28;
  Selection *local_20;
  Selection *selection_local;
  XFormWidget *pXStack_10;
  int pickID_local;
  XFormWidget *this_local;
  
  local_20 = selection;
  selection_local._4_4_ = pickID;
  pXStack_10 = this;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_CMU462::DynamicScene::Selection::Axis,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::DynamicScene::Selection::Axis>_>_>
       ::find(&this->pickIDToAxis,(key_type_conflict *)((long)&selection_local + 4));
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_CMU462::DynamicScene::Selection::Axis,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::DynamicScene::Selection::Axis>_>_>
       ::end(&this->pickIDToAxis);
  bVar2 = std::operator!=(&local_28,&local_30);
  if (bVar2) {
    Selection::clear(local_20);
    local_20->object = &this->super_SceneObject;
    local_20->element = (HalfedgeElement *)0x0;
    pmVar3 = std::
             map<int,_CMU462::DynamicScene::Selection::Axis,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::DynamicScene::Selection::Axis>_>_>
             ::operator[](&this->pickIDToAxis,(key_type_conflict *)((long)&selection_local + 4));
    mVar1 = *pmVar3;
    (this->target).axis = mVar1;
    local_20->axis = mVar1;
  }
  else {
    (this->target).axis = None;
  }
  return;
}

Assistant:

void XFormWidget::setSelection( int pickID, Selection& selection )
{
   if( pickIDToAxis.find(pickID) != pickIDToAxis.end() )
   {
      selection.clear();
      selection.object = this;
      selection.element = nullptr;
      selection.axis = target.axis = pickIDToAxis[pickID];
   }
   else
   {
      target.axis = Selection::Axis::None;
   }
}